

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

void __thiscall testing::Sequence::AddExpectation(Sequence *this,Expectation *expectation)

{
  Expectation *__v;
  ExpectationBase *pEVar1;
  ExpectationBase *pEVar2;
  
  __v = (this->last_expectation_).value_;
  pEVar1 = (__v->expectation_base_).value_;
  pEVar2 = (expectation->expectation_base_).value_;
  if (pEVar1 != pEVar2) {
    if (pEVar1 != (ExpectationBase *)0x0) {
      std::
      _Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
      ::_M_insert_unique<testing::Expectation_const&>
                ((_Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
                  *)&pEVar2->immediate_prerequisites_,__v);
    }
    internal::linked_ptr<testing::internal::ExpectationBase>::operator=
              (&((this->last_expectation_).value_)->expectation_base_,
               &expectation->expectation_base_);
    return;
  }
  return;
}

Assistant:

void Sequence::AddExpectation(const Expectation& expectation) const {
  if (*last_expectation_ != expectation) {
    if (last_expectation_->expectation_base() != NULL) {
      expectation.expectation_base()->immediate_prerequisites_
          += *last_expectation_;
    }
    *last_expectation_ = expectation;
  }
}